

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

char * CBinds::GetModifierName(int m)

{
  int m_local;
  char *local_8;
  
  switch(m) {
  case 0:
    local_8 = "";
    break;
  case 1:
    local_8 = "shift+";
    break;
  case 2:
    local_8 = "ctrl+";
    break;
  case 3:
    local_8 = "alt+";
    break;
  default:
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char *CBinds::GetModifierName(int m)
{
	switch(m)
	{
		case 0:
			return "";
		case MODIFIER_SHIFT:
			return "shift+";
		case MODIFIER_CTRL:
			return "ctrl+";
		case MODIFIER_ALT:
			return "alt+";
		default:
			return "";
	}
}